

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  LogMessage *other;
  ZeroCopyCodedInputStream zcis;
  ParseContext ctx;
  LogFinisher local_f1;
  ZeroCopyInputStream local_f0;
  CodedInputStream *local_e8;
  EpsCopyInputStream local_e0;
  int local_88;
  undefined4 local_84;
  DescriptorPool *local_80;
  MessageFactory *pMStack_78;
  undefined8 local_70;
  LogMessage local_68;
  
  local_f0._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_004be678;
  local_88 = input->recursion_budget_;
  local_e0.aliasing_ = (uintptr_t)input->aliasing_enabled_;
  cVar1 = '\0';
  local_e0.buffer_[0x18] = '\0';
  local_e0.buffer_[0x19] = '\0';
  local_e0.buffer_[0x1a] = '\0';
  local_e0.buffer_[0x1b] = '\0';
  local_e0.buffer_[0x1c] = '\0';
  local_e0.buffer_[0x1d] = '\0';
  local_e0.buffer_[0x1e] = '\0';
  local_e0.buffer_[0x1f] = '\0';
  local_e0.buffer_[8] = '\0';
  local_e0.buffer_[9] = '\0';
  local_e0.buffer_[10] = '\0';
  local_e0.buffer_[0xb] = '\0';
  local_e0.buffer_[0xc] = '\0';
  local_e0.buffer_[0xd] = '\0';
  local_e0.buffer_[0xe] = '\0';
  local_e0.buffer_[0xf] = '\0';
  local_e0.buffer_[0x10] = '\0';
  local_e0.buffer_[0x11] = '\0';
  local_e0.buffer_[0x12] = '\0';
  local_e0.buffer_[0x13] = '\0';
  local_e0.buffer_[0x14] = '\0';
  local_e0.buffer_[0x15] = '\0';
  local_e0.buffer_[0x16] = '\0';
  local_e0.buffer_[0x17] = '\0';
  local_e0.zcis_ = (ZeroCopyInputStream *)0x0;
  local_e0.buffer_[0] = '\0';
  local_e0.buffer_[1] = '\0';
  local_e0.buffer_[2] = '\0';
  local_e0.buffer_[3] = '\0';
  local_e0.buffer_[4] = '\0';
  local_e0.buffer_[5] = '\0';
  local_e0.buffer_[6] = '\0';
  local_e0.buffer_[7] = '\0';
  local_e0.last_tag_minus_1_ = 0;
  local_e0.overall_limit_ = 0x7fffffff;
  local_84 = 0x80000000;
  local_80 = (DescriptorPool *)0x0;
  pMStack_78 = (MessageFactory *)0x0;
  local_70 = 0;
  local_e8 = input;
  pcVar3 = internal::EpsCopyInputStream::InitFrom(&local_e0,&local_f0);
  local_84 = 0;
  local_80 = input->extension_pool_;
  pMStack_78 = input->extension_factory_;
  iVar2 = (*this->_vptr_MessageLite[10])(this,pcVar3,&local_e0);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar3 != (char *)0x0) {
    internal::EpsCopyInputStream::BackUp(&local_e0,pcVar3);
    if (local_e0.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if (local_e0.last_tag_minus_1_ == 0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0xe9);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=(&local_f1,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      if ((local_e0.limit_end_ < pcVar3) &&
         ((local_e0.next_chunk_ == (char *)0x0 ||
          ((long)local_e0.limit_ < (long)pcVar3 - (long)local_e0.buffer_end_)))) {
        return false;
      }
      input->last_tag_ = local_e0.last_tag_minus_1_ + 1;
    }
    if ((parse_flags & kMergePartial) == kMerge) {
      iVar2 = (*this->_vptr_MessageLite[5])(this);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        LogInitializationErrorMessage(this);
      }
    }
    else {
      cVar1 = '\x01';
    }
  }
  return (bool)cVar1;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}